

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_batch_insert.cpp
# Opt level: O2

PhysicalIndex __thiscall
duckdb::BatchInsertGlobalState::MergeCollections
          (BatchInsertGlobalState *this,ClientContext *context,
          vector<duckdb::RowGroupBatchEntry,_true> *merge_collections,OptimisticDataWriter *writer)

{
  pointer pRVar1;
  int iVar2;
  undefined4 extraout_var;
  PhysicalIndex PVar3;
  idx_t memory_reduction;
  RowGroupBatchEntry *entry;
  pointer pRVar4;
  CollectionMerger merger;
  
  iVar2 = (*(this->table->super_TableCatalogEntry).super_StandardEntry.super_InCatalogEntry.
            super_CatalogEntry._vptr_CatalogEntry[0x10])();
  merger.data_table = (DataTable *)CONCAT44(extraout_var,iVar2);
  merger.collection_indexes.
  super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
  super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  merger.collection_indexes.
  super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
  super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  merger.collection_indexes.
  super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
  super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  merger.batch_type = NOT_FLUSHED;
  pRVar1 = (merge_collections->
           super_vector<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>).
           super__Vector_base<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  memory_reduction = 0;
  merger.context = context;
  for (pRVar4 = (merge_collections->
                super_vector<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>
                ).
                super__Vector_base<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>
                ._M_impl.super__Vector_impl_data._M_start; pRVar4 != pRVar1; pRVar4 = pRVar4 + 1) {
    CollectionMerger::AddCollection
              (&merger,(PhysicalIndex)(pRVar4->collection_index).index,NOT_FLUSHED);
    memory_reduction = memory_reduction + pRVar4->unflushed_memory;
  }
  LOCK();
  (this->optimistically_written)._M_base._M_i = true;
  UNLOCK();
  BatchMemoryManager::ReduceUnflushedMemory(&this->memory_manager,memory_reduction);
  PVar3 = CollectionMerger::Flush(&merger,writer);
  ::std::_Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>::~_Vector_base
            ((_Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_> *)
             &merger.collection_indexes);
  return (PhysicalIndex)PVar3.index;
}

Assistant:

PhysicalIndex BatchInsertGlobalState::MergeCollections(ClientContext &context,
                                                       const vector<RowGroupBatchEntry> &merge_collections,
                                                       OptimisticDataWriter &writer) {
	D_ASSERT(!merge_collections.empty());
	CollectionMerger merger(context, table.GetStorage());
	idx_t written_data = 0;
	for (auto &entry : merge_collections) {
		merger.AddCollection(entry.collection_index, RowGroupBatchType::NOT_FLUSHED);
		written_data += entry.unflushed_memory;
	}
	optimistically_written = true;
	memory_manager.ReduceUnflushedMemory(written_data);
	return merger.Flush(writer);
}